

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O2

vector<long,_std::allocator<long>_> *
phmap::priv::GenerateValuesWithSeed<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,size_t n,int maxval,int seed)

{
  size_t i;
  size_t sVar1;
  Generator<long> gen;
  vector<int,_std::allocator<int>_> nums;
  Generator<long> local_54;
  long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  GenerateNumbersWithSeed((vector<int,_std::allocator<int>_> *)&local_48,n,maxval,seed);
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_54.maxval = maxval;
  std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,n);
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    local_50 = Generator<long>::operator()
                         (&local_54,local_48._M_impl.super__Vector_impl_data._M_start[sVar1]);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_50);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }